

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall
HModel::util_extractCols
          (HModel *this,int firstcol,int lastcol,double *XcolLower,double *XcolUpper,int *nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[firstcol];
  iVar6 = iVar1;
  if (firstcol <= lastcol) {
    pdVar3 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      XcolLower[lVar8] = pdVar3[firstcol + lVar8];
      XcolUpper[lVar8] = pdVar4[firstcol + lVar8];
      XAstart[lVar8] = piVar2[firstcol + lVar8] - iVar1;
      lVar8 = lVar8 + 1;
    } while ((lastcol - firstcol) + 1 != (int)lVar8);
    iVar6 = piVar2[firstcol];
  }
  iVar7 = piVar2[(long)lastcol + 1];
  if (iVar6 < iVar7) {
    piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)iVar6;
    do {
      XAindex[lVar8 - iVar1] = piVar5[lVar8];
      XAvalue[lVar8 - iVar1] = pdVar3[lVar8];
      lVar8 = lVar8 + 1;
      iVar7 = piVar2[(long)lastcol + 1];
    } while (lVar8 < iVar7);
  }
  *nnonz = iVar7 - iVar1;
  return;
}

Assistant:

void HModel::util_extractCols(int firstcol, int lastcol, double* XcolLower, double* XcolUpper,
			  int* nnonz, int* XAstart, int* XAindex, double* XAvalue) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  //Determine the number of columns to be extracted
  //int numExtractCols = lastcol-firstcol+1;
  //printf("Extracting %d columns\n", numExtractCols);cout << flush;
  int elOs = Astart[firstcol];
  for (int col = firstcol; col <= lastcol; col++) {
    //    printf("Extracting column %d\n", col);cout << flush;
    XcolLower[col-firstcol] = colLower[col];
    XcolUpper[col-firstcol] = colUpper[col];
    XAstart[col-firstcol] = Astart[col]-elOs;
  }
  for (int el = Astart[firstcol]; el < Astart[lastcol+1]; el++) {
    XAindex[el-elOs] = Aindex[el];
    XAvalue[el-elOs] = Avalue[el];
  }
  *nnonz = Astart[lastcol+1]-elOs;
}